

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsslsocket.cpp
# Opt level: O3

void QSslSocket::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  InterfaceType *pIVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined8 local_20;
  void *local_18;
  undefined8 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (_id == 2) {
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
LAB_0025072a:
        *puVar4 = pIVar5;
        goto switchD_00250657_default;
      }
    }
    else if (_id == 0x10) {
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketState>::metaType;
        goto LAB_0025072a;
      }
    }
    else if (_id == 0x11) {
      puVar4 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        pIVar5 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketError>::metaType;
        goto LAB_0025072a;
      }
    }
    else {
      puVar4 = (undefined8 *)*_a;
    }
    *puVar4 = 0;
    goto switchD_00250657_default;
  }
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == encrypted && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == peerVerifyError && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    else if (pcVar1 == sslErrors && lVar2 == 0) {
      *(undefined4 *)*_a = 2;
    }
    else if (pcVar1 == modeChanged && lVar2 == 0) {
      *(undefined4 *)*_a = 3;
    }
    else if (pcVar1 == encryptedBytesWritten && lVar2 == 0) {
      *(undefined4 *)*_a = 4;
    }
    else if (pcVar1 == preSharedKeyAuthenticationRequired && lVar2 == 0) {
      *(undefined4 *)*_a = 5;
    }
    else if (pcVar1 == newSessionTicketReceived && lVar2 == 0) {
      *(undefined4 *)*_a = 6;
    }
    else if (pcVar1 == alertSent && lVar2 == 0) {
      *(undefined4 *)*_a = 7;
    }
    else if (pcVar1 == alertReceived && lVar2 == 0) {
      *(undefined4 *)*_a = 8;
    }
    else if (pcVar1 == handshakeInterruptedOnError && lVar2 == 0) {
      *(undefined4 *)*_a = 9;
    }
    goto switchD_00250657_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_00250657_default;
  switch(_id) {
  case 0:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar6 = 0;
LAB_00250a84:
      QMetaObject::activate(_o,&staticMetaObject,iVar6,(void **)0x0);
      return;
    }
    break;
  case 1:
    local_10 = (undefined8 *)_a[1];
    iVar6 = 1;
    goto LAB_002509ea;
  case 2:
    local_10 = (undefined8 *)_a[1];
    iVar6 = 2;
    goto LAB_002509ea;
  case 3:
    local_10 = &local_20;
    local_20 = CONCAT44(local_20._4_4_,*_a[1]);
    iVar6 = 3;
    goto LAB_002509ea;
  case 4:
    local_20 = *_a[1];
    local_10 = &local_20;
    iVar6 = 4;
    goto LAB_002509ea;
  case 5:
    local_20 = *_a[1];
    local_10 = &local_20;
    iVar6 = 5;
    goto LAB_002509ea;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      iVar6 = 6;
      goto LAB_00250a84;
    }
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      alertSent((QSslSocket *)_o,*_a[1],*_a[2],(QString *)_a[3]);
      return;
    }
    break;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      alertReceived((QSslSocket *)_o,*_a[1],*_a[2],(QString *)_a[3]);
      return;
    }
    break;
  case 9:
    local_10 = (undefined8 *)_a[1];
    iVar6 = 9;
LAB_002509ea:
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar6,&local_18);
  default:
switchD_00250657_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      startClientEncryption((QSslSocket *)_o);
      return;
    }
    break;
  case 0xb:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      startServerEncryption((QSslSocket *)_o);
      return;
    }
    break;
  case 0xc:
    *(undefined1 *)(*(long *)(_o + 8) + 0x276) = 1;
    goto switchD_00250657_default;
  case 0xd:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QSslSocketPrivate::_q_connectedSlot(*(QSslSocketPrivate **)(_o + 8));
      return;
    }
    break;
  case 0xe:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QAbstractSocket::hostFound(*(QAbstractSocket **)(*(long *)(_o + 8) + 8));
      return;
    }
    break;
  case 0xf:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QSslSocketPrivate::_q_disconnectedSlot(*(QSslSocketPrivate **)(_o + 8));
      return;
    }
    break;
  case 0x10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QSslSocketPrivate::_q_stateChangedSlot(*(QSslSocketPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case 0x11:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QSslSocketPrivate::_q_errorSlot(*(QSslSocketPrivate **)(_o + 8),ConnectionRefusedError);
      return;
    }
    break;
  case 0x12:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QSslSocketPrivate::_q_readyReadSlot(*(QSslSocketPrivate **)(_o + 8));
      return;
    }
    break;
  case 0x13:
    if (*(int *)(*(long *)(_o + 8) + 0x270) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QIODevice::channelReadyRead((int)*(undefined8 *)(*(long *)(_o + 8) + 8));
        return;
      }
      break;
    }
    goto switchD_00250657_default;
  case 0x14:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QSslSocketPrivate::_q_bytesWrittenSlot(*(QSslSocketPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case 0x15:
    if (*(int *)(*(long *)(_o + 8) + 0x270) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QIODevice::channelBytesWritten((int)*(undefined8 *)(*(long *)(_o + 8) + 8),(ulong)*_a[1]);
        return;
      }
      break;
    }
    goto switchD_00250657_default;
  case 0x16:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QIODevice::readChannelFinished();
      return;
    }
    break;
  case 0x17:
    lVar2 = *(long *)(_o + 8);
    *(undefined1 *)(lVar2 + 0x401) = 0;
    if ((*(long *)(lVar2 + 0x98) != 0) && (*(long *)(*(long *)(lVar2 + 0x98) + 0x18) != 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QAbstractSocket::flush(*(QAbstractSocket **)(lVar2 + 8));
        return;
      }
      break;
    }
    goto switchD_00250657_default;
  case 0x18:
    if ((*(int *)(*(long *)(_o + 8) + 0x270) != 0) &&
       (plVar3 = *(long **)(*(long *)(_o + 8) + 0x408), plVar3 != (long *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        (**(code **)(*plVar3 + 200))();
        return;
      }
      break;
    }
    goto switchD_00250657_default;
  case 0x19:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QSslSocketPrivate::_q_resumeImplementation(*(QSslSocketPrivate **)(_o + 8));
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocket::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSslSocket *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->encrypted(); break;
        case 1: _t->peerVerifyError((*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[1]))); break;
        case 2: _t->sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 3: _t->modeChanged((*reinterpret_cast< std::add_pointer_t<QSslSocket::SslMode>>(_a[1]))); break;
        case 4: _t->encryptedBytesWritten((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 5: _t->preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 6: _t->newSessionTicketReceived(); break;
        case 7: _t->alertSent((*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 8: _t->alertReceived((*reinterpret_cast< std::add_pointer_t<QSsl::AlertLevel>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QSsl::AlertType>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 9: _t->handshakeInterruptedOnError((*reinterpret_cast< std::add_pointer_t<QSslError>>(_a[1]))); break;
        case 10: _t->startClientEncryption(); break;
        case 11: _t->startServerEncryption(); break;
        case 12: _t->ignoreSslErrors(); break;
        case 13: _t->d_func()->_q_connectedSlot(); break;
        case 14: _t->d_func()->_q_hostFoundSlot(); break;
        case 15: _t->d_func()->_q_disconnectedSlot(); break;
        case 16: _t->d_func()->_q_stateChangedSlot((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketState>>(_a[1]))); break;
        case 17: _t->d_func()->_q_errorSlot((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        case 18: _t->d_func()->_q_readyReadSlot(); break;
        case 19: _t->d_func()->_q_channelReadyReadSlot((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 20: _t->d_func()->_q_bytesWrittenSlot((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 21: _t->d_func()->_q_channelBytesWrittenSlot((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<qint64>>(_a[2]))); break;
        case 22: _t->d_func()->_q_readChannelFinishedSlot(); break;
        case 23: _t->d_func()->_q_flushWriteBuffer(); break;
        case 24: _t->d_func()->_q_flushReadBuffer(); break;
        case 25: _t->d_func()->_q_resumeImplementation(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 16:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketState >(); break;
            }
            break;
        case 17:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)()>(_a, &QSslSocket::encrypted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QSslError & )>(_a, &QSslSocket::peerVerifyError, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QList<QSslError> & )>(_a, &QSslSocket::sslErrors, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSslSocket::SslMode )>(_a, &QSslSocket::modeChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(qint64 )>(_a, &QSslSocket::encryptedBytesWritten, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSslPreSharedKeyAuthenticator * )>(_a, &QSslSocket::preSharedKeyAuthenticationRequired, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)()>(_a, &QSslSocket::newSessionTicketReceived, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslSocket::alertSent, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(QSsl::AlertLevel , QSsl::AlertType , const QString & )>(_a, &QSslSocket::alertReceived, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QSslSocket::*)(const QSslError & )>(_a, &QSslSocket::handshakeInterruptedOnError, 9))
            return;
    }
}